

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

void Abc_AigAndDelete(Abc_Aig_t *pMan,Abc_Obj_t *pThis)

{
  void *p;
  Abc_Obj_t **ppAVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  Abc_Obj_t **ppAVar4;
  
  if (((ulong)pThis & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pThis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x222,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  if ((*(uint *)&pThis->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pThis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x223,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  if ((pThis->vFanins).nSize != 2) {
    __assert_fail("Abc_ObjFaninNum(pThis) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x224,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
  }
  if (pMan->pNtkAig == pThis->pNtk) {
    pAVar3 = Abc_ObjChild0(pThis);
    p1 = Abc_ObjChild1(pThis);
    uVar2 = Abc_HashKey2(pAVar3,p1,pMan->nBins);
    ppAVar1 = pMan->pBins + uVar2;
    do {
      ppAVar4 = ppAVar1;
      pAVar3 = *ppAVar4;
      if (pAVar3 == (Abc_Obj_t *)0x0) {
        __assert_fail("pAnd == pThis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                      ,0x236,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
      }
      ppAVar1 = &pAVar3->pNext;
    } while (pAVar3 != pThis);
    *ppAVar4 = pAVar3->pNext;
    pMan->nEntries = pMan->nEntries + -1;
    p = pThis->pNtk->pManCut;
    if (p != (void *)0x0) {
      Abc_NodeFreeCuts(p,pThis);
      return;
    }
    return;
  }
  __assert_fail("pMan->pNtkAig == pThis->pNtk",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                ,0x225,"void Abc_AigAndDelete(Abc_Aig_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_AigAndDelete( Abc_Aig_t * pMan, Abc_Obj_t * pThis )
{
    Abc_Obj_t * pAnd, * pAnd0, * pAnd1, ** ppPlace;
    unsigned Key;
    assert( !Abc_ObjIsComplement(pThis) );
    assert( Abc_ObjIsNode(pThis) );
    assert( Abc_ObjFaninNum(pThis) == 2 );
    assert( pMan->pNtkAig == pThis->pNtk );
    // get the hash key for these two nodes
    pAnd0 = Abc_ObjRegular( Abc_ObjChild0(pThis) );
    pAnd1 = Abc_ObjRegular( Abc_ObjChild1(pThis) );
    Key = Abc_HashKey2( Abc_ObjChild0(pThis), Abc_ObjChild1(pThis), pMan->nBins );
    // find the matching node in the table
    ppPlace = pMan->pBins + Key;
    Abc_AigBinForEachEntry( pMan->pBins[Key], pAnd )
    {
        if ( pAnd != pThis )
        {
            ppPlace = &pAnd->pNext;
            continue;
        }
        *ppPlace = pAnd->pNext;
        break;
    }
    assert( pAnd == pThis );
    pMan->nEntries--;
    // delete the cuts if defined
    if ( pThis->pNtk->pManCut )
        Abc_NodeFreeCuts( pThis->pNtk->pManCut, pThis );
}